

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O3

void __thiscall
google::protobuf::StringPiece::StringPiece
          (StringPiece *this,StringPiece x,stringpiece_ssize_type pos,stringpiece_ssize_type len)

{
  long lVar1;
  LogMessage *pLVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  this->ptr_ = x.ptr_ + pos;
  lVar1 = x.length_ - pos;
  if (len <= lVar1) {
    lVar1 = len;
  }
  this->length_ = lVar1;
  if (pos < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x3c);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (0) <= (pos): ");
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (x.length_ < pos) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x3d);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (pos) <= (x.length_): ");
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if (len < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/stringpiece.cc"
               ,0x3e);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (len) >= (0): ");
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

StringPiece::StringPiece(StringPiece x,
                         stringpiece_ssize_type pos,
                         stringpiece_ssize_type len)
    : ptr_(x.ptr_ + pos), length_(std::min(len, x.length_ - pos)) {
  GOOGLE_DCHECK_LE(0, pos);
  GOOGLE_DCHECK_LE(pos, x.length_);
  GOOGLE_DCHECK_GE(len, 0);
}